

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmakemain.cxx
# Opt level: O2

void cmakemainProgressCallback(char *m,float prog,void *clientdata)

{
  int iVar1;
  cmMakefile *this;
  ostream *poVar2;
  string dir;
  string local_38;
  
  this = cmakemainGetMakefile(clientdata);
  dir._M_dataplus._M_p = (pointer)&dir.field_2;
  dir._M_string_length = 0;
  dir.field_2._M_local_buf[0] = '\0';
  if (this != (cmMakefile *)0x0) {
    iVar1 = strncmp(m,"Configuring",0xb);
    if ((0.0 <= prog) || (iVar1 != 0)) {
      iVar1 = strncmp(m,"Generating",10);
      if (iVar1 != 0) goto LAB_00265321;
      std::__cxx11::string::assign((char *)&dir);
      cmMakefile::GetCurrentBinaryDirectory(this);
    }
    else {
      std::__cxx11::string::assign((char *)&dir);
      cmMakefile::GetCurrentSourceDirectory(this);
    }
    std::__cxx11::string::append((char *)&dir);
  }
LAB_00265321:
  if ((prog < 0.0) || (dir._M_string_length != 0)) {
    poVar2 = std::operator<<((ostream *)&std::cout,"-- ");
    poVar2 = std::operator<<(poVar2,m);
    poVar2 = std::operator<<(poVar2,(string *)&dir);
    cmakemainGetStack_abi_cxx11_(&local_38,clientdata);
    poVar2 = std::operator<<(poVar2,(string *)&local_38);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&local_38);
  }
  std::ostream::flush();
  std::__cxx11::string::~string((string *)&dir);
  return;
}

Assistant:

static void cmakemainProgressCallback(const char *m, float prog,
                                      void* clientdata)
{
  cmMakefile* mf = cmakemainGetMakefile(clientdata);
  std::string dir;
  if ((mf) && (strstr(m, "Configuring")==m) && (prog<0))
    {
    dir = " ";
    dir += mf->GetCurrentSourceDirectory();
    }
  else if ((mf) && (strstr(m, "Generating")==m))
    {
    dir = " ";
    dir += mf->GetCurrentBinaryDirectory();
    }

  if ((prog < 0) || (!dir.empty()))
    {
    std::cout << "-- " << m << dir << cmakemainGetStack(clientdata)<<std::endl;
    }

  std::cout.flush();
}